

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O3

void poly1305_donna::poly1305_blocks(poly1305_context *st,uchar *m,size_t bytes)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  uint32_t uVar19;
  ulong uVar20;
  uint32_t uVar21;
  ulong uVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar17 = st->h[0];
  uVar3 = st->h[1];
  uVar21 = st->h[2];
  uVar4 = st->h[3];
  uVar19 = st->h[4];
  if (0xf < bytes) {
    uVar10 = (ulong)(st->r[4] * 5);
    uVar1 = st->r[3];
    uVar11 = (ulong)(uVar1 * 5);
    uVar12 = (ulong)st->r[2];
    uVar13 = (ulong)(st->r[2] * 5);
    uVar6 = (ulong)st->r[0];
    uVar7 = (ulong)st->r[1];
    do {
      uVar20 = (ulong)((*(uint *)m & 0x3ffffff) + uVar17);
      uVar14 = (ulong)((*(uint *)((long)m + 3) >> 2 & 0x3ffffff) + uVar3);
      uVar18 = (ulong)((*(uint *)((long)m + 6) >> 4 & 0x3ffffff) + uVar21);
      uVar23 = (ulong)((*(uint *)((long)m + 9) >> 6) + uVar4);
      uVar9 = (ulong)((*(uint *)((long)m + 0xc) >> 8) +
                     uVar19 + (uint)(st->final == '\0') * 0x1000000);
      uVar8 = uVar9 * (st->r[1] * 5) +
              uVar23 * uVar13 + uVar18 * uVar11 + uVar14 * uVar10 + uVar20 * uVar6;
      uVar15 = (uVar8 >> 0x1a & 0xffffffff) +
               uVar9 * uVar13 + uVar23 * uVar11 + uVar18 * uVar10 + uVar14 * uVar6 + uVar20 * uVar7;
      uVar22 = (uVar15 >> 0x1a & 0xffffffff) +
               uVar9 * uVar11 + uVar23 * uVar10 + uVar18 * uVar6 + uVar14 * uVar7 + uVar20 * uVar12;
      uVar5 = (uVar22 >> 0x1a & 0xffffffff) +
              uVar9 * uVar10 + uVar23 * uVar6 + uVar18 * uVar7 + uVar14 * uVar12 + uVar20 * uVar1;
      uVar20 = (uVar5 >> 0x1a & 0xffffffff) +
               uVar9 * uVar6 + uVar23 * uVar7 + uVar18 * uVar12 + uVar14 * uVar1 + uVar20 * st->r[4]
      ;
      uVar16 = (int)(uVar20 >> 0x1a) * 5 + ((uint)uVar8 & 0x3ffffff);
      uVar3 = (uVar16 >> 0x1a) + ((uint)uVar15 & 0x3ffffff);
      uVar21 = (uint)uVar22 & 0x3ffffff;
      uVar4 = (uint)uVar5 & 0x3ffffff;
      uVar19 = (uint)uVar20 & 0x3ffffff;
      uVar17 = uVar16 & 0x3ffffff;
      m = (uchar *)((long)m + 0x10);
      bytes = bytes - 0x10;
    } while (0xf < bytes);
  }
  st->h[0] = uVar17;
  st->h[1] = uVar3;
  st->h[2] = uVar21;
  st->h[3] = uVar4;
  st->h[4] = uVar19;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void poly1305_blocks(poly1305_context *st, const unsigned char *m, size_t bytes) noexcept {
    const uint32_t hibit = (st->final) ? 0 : (1UL << 24); /* 1 << 128 */
    uint32_t r0,r1,r2,r3,r4;
    uint32_t s1,s2,s3,s4;
    uint32_t h0,h1,h2,h3,h4;
    uint64_t d0,d1,d2,d3,d4;
    uint32_t c;

    r0 = st->r[0];
    r1 = st->r[1];
    r2 = st->r[2];
    r3 = st->r[3];
    r4 = st->r[4];

    s1 = r1 * 5;
    s2 = r2 * 5;
    s3 = r3 * 5;
    s4 = r4 * 5;

    h0 = st->h[0];
    h1 = st->h[1];
    h2 = st->h[2];
    h3 = st->h[3];
    h4 = st->h[4];

    while (bytes >= POLY1305_BLOCK_SIZE) {
        /* h += m[i] */
        h0 += (ReadLE32(m+ 0)     ) & 0x3ffffff;
        h1 += (ReadLE32(m+ 3) >> 2) & 0x3ffffff;
        h2 += (ReadLE32(m+ 6) >> 4) & 0x3ffffff;
        h3 += (ReadLE32(m+ 9) >> 6) & 0x3ffffff;
        h4 += (ReadLE32(m+12) >> 8) | hibit;

        /* h *= r */
        d0 = ((uint64_t)h0 * r0) + ((uint64_t)h1 * s4) + ((uint64_t)h2 * s3) + ((uint64_t)h3 * s2) + ((uint64_t)h4 * s1);
        d1 = ((uint64_t)h0 * r1) + ((uint64_t)h1 * r0) + ((uint64_t)h2 * s4) + ((uint64_t)h3 * s3) + ((uint64_t)h4 * s2);
        d2 = ((uint64_t)h0 * r2) + ((uint64_t)h1 * r1) + ((uint64_t)h2 * r0) + ((uint64_t)h3 * s4) + ((uint64_t)h4 * s3);
        d3 = ((uint64_t)h0 * r3) + ((uint64_t)h1 * r2) + ((uint64_t)h2 * r1) + ((uint64_t)h3 * r0) + ((uint64_t)h4 * s4);
        d4 = ((uint64_t)h0 * r4) + ((uint64_t)h1 * r3) + ((uint64_t)h2 * r2) + ((uint64_t)h3 * r1) + ((uint64_t)h4 * r0);

        /* (partial) h %= p */
                      c = (uint32_t)(d0 >> 26); h0 = (uint32_t)d0 & 0x3ffffff;
        d1 += c;      c = (uint32_t)(d1 >> 26); h1 = (uint32_t)d1 & 0x3ffffff;
        d2 += c;      c = (uint32_t)(d2 >> 26); h2 = (uint32_t)d2 & 0x3ffffff;
        d3 += c;      c = (uint32_t)(d3 >> 26); h3 = (uint32_t)d3 & 0x3ffffff;
        d4 += c;      c = (uint32_t)(d4 >> 26); h4 = (uint32_t)d4 & 0x3ffffff;
        h0 += c * 5;  c =           (h0 >> 26); h0 =           h0 & 0x3ffffff;
        h1 += c;

        m += POLY1305_BLOCK_SIZE;
        bytes -= POLY1305_BLOCK_SIZE;
    }

    st->h[0] = h0;
    st->h[1] = h1;
    st->h[2] = h2;
    st->h[3] = h3;
    st->h[4] = h4;
}